

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CEditor::DoQuad(CEditor *this,CQuad *q,int Index)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  CPoint *pID_00;
  CUI *pCVar6;
  IInput *pIVar7;
  IGraphics *pIVar8;
  CUI *pCVar9;
  CPoint *pCVar10;
  int in_EDX;
  CPoint *in_RSI;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  float fVar11;
  float fVar12;
  float x_00;
  float y_00;
  float fVar13;
  float fVar14;
  vec4 vVar15;
  int v_2;
  int v_1;
  int v;
  int DiffY;
  int DiffX;
  int OldY;
  int OldX;
  float y_1;
  float x_1;
  int LineDistance_1;
  float y;
  float x;
  int LineDistance;
  bool IgnoreGrid;
  float dy;
  float dx;
  float CenterY;
  float CenterX;
  float wy;
  float wx;
  void *pID;
  CQuadItem QuadItem;
  vec4 PivotColor;
  CQuadItem QuadItem_1;
  void *in_stack_ffffffffffffff08;
  CQuadItem *this_00;
  undefined8 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int local_d8;
  int local_d4;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  float local_bc;
  float local_b8;
  float local_b0;
  float local_ac;
  CQuadItem local_68;
  vec4 local_58;
  vec4 local_48;
  vec4 local_38;
  vector4_base<float> local_28;
  CQuadItem local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pID_00 = in_RSI + 4;
  pCVar6 = UI(in_RDI);
  fVar11 = CUI::MouseWorldX(pCVar6);
  pCVar6 = UI(in_RDI);
  fVar12 = CUI::MouseWorldY(pCVar6);
  x_00 = fx2f(in_RSI[4].x);
  y_00 = fx2f(in_RSI[4].y);
  fVar13 = (x_00 - fVar11) / in_RDI->m_WorldZoom;
  fVar14 = (y_00 - fVar12) / in_RDI->m_WorldZoom;
  if (fVar13 * fVar13 + fVar14 * fVar14 < 50.0) {
    pCVar6 = UI(in_RDI);
    CUI::SetHotItem(pCVar6,pID_00);
  }
  pIVar7 = Input(in_RDI);
  uVar3 = (*(pIVar7->super_IInterface)._vptr_IInterface[4])(pIVar7,0x162);
  if ((uVar3 & 1) == 0) {
    pIVar7 = Input(in_RDI);
    uVar3 = (*(pIVar7->super_IInterface)._vptr_IInterface[4])(pIVar7,0x166);
    if ((uVar3 & 1) != 0) goto LAB_001ee875;
    bVar2 = false;
  }
  else {
LAB_001ee875:
    bVar2 = true;
  }
  if (in_RDI->m_SelectedQuad == in_EDX) {
    pIVar8 = Graphics(in_RDI);
    (*(pIVar8->super_IInterface)._vptr_IInterface[0x21])(0,0,0,0x3f800000);
    IGraphics::CQuadItem::CQuadItem
              (&local_18,x_00,y_00,in_RDI->m_WorldZoom * 7.0,in_RDI->m_WorldZoom * 7.0);
    pIVar8 = Graphics(in_RDI);
    (*(pIVar8->super_IInterface)._vptr_IInterface[0x1c])(pIVar8,&local_18,1);
  }
  vector4_base<float>::vector4_base(&local_28);
  pCVar6 = UI(in_RDI);
  bVar1 = CUI::CheckActiveItem(pCVar6,pID_00);
  if (bVar1) {
    if (0.5 < in_RDI->m_MouseDeltaWx * in_RDI->m_MouseDeltaWx +
              in_RDI->m_MouseDeltaWy * in_RDI->m_MouseDeltaWy) {
      if (DoQuad::s_Operation == 2) {
        if (((in_RDI->m_GridActive & 1U) == 0) || (bVar2)) {
          iVar4 = f2fx(fVar11 - DoQuad::s_LastWx);
          in_RSI[4].x = iVar4 + in_RSI[4].x;
          iVar4 = f2fx(fVar12 - DoQuad::s_LastWy);
          in_RSI[4].y = iVar4 + in_RSI[4].y;
        }
        else {
          iVar4 = GetLineDistance(in_RDI);
          if (fVar11 < 0.0) {
            iVar5 = (int)((fVar11 - (float)((iVar4 / 2) * in_RDI->m_GridFactor)) /
                         (float)(iVar4 * in_RDI->m_GridFactor)) * iVar4 * in_RDI->m_GridFactor;
          }
          else {
            iVar5 = (int)((fVar11 + (float)((iVar4 / 2) * in_RDI->m_GridFactor)) /
                         (float)(iVar4 * in_RDI->m_GridFactor)) * iVar4 * in_RDI->m_GridFactor;
          }
          local_ac = (float)iVar5;
          if (fVar12 < 0.0) {
            iVar4 = (int)((fVar12 - (float)((iVar4 / 2) * in_RDI->m_GridFactor)) /
                         (float)(iVar4 * in_RDI->m_GridFactor)) * iVar4 * in_RDI->m_GridFactor;
          }
          else {
            iVar4 = (int)((fVar12 + (float)((iVar4 / 2) * in_RDI->m_GridFactor)) /
                         (float)(iVar4 * in_RDI->m_GridFactor)) * iVar4 * in_RDI->m_GridFactor;
          }
          local_b0 = (float)iVar4;
          iVar4 = f2fx(local_ac);
          in_RSI[4].x = iVar4;
          iVar4 = f2fx(local_b0);
          in_RSI[4].y = iVar4;
        }
      }
      else if (DoQuad::s_Operation == 1) {
        if (((in_RDI->m_GridActive & 1U) == 0) || (bVar2)) {
          for (local_d4 = 0; local_d4 < 5; local_d4 = local_d4 + 1) {
            iVar4 = f2fx(fVar11 - DoQuad::s_LastWx);
            in_RSI[local_d4].x = iVar4 + in_RSI[local_d4].x;
            iVar4 = f2fx(fVar12 - DoQuad::s_LastWy);
            in_RSI[local_d4].y = iVar4 + in_RSI[local_d4].y;
          }
        }
        else {
          iVar4 = GetLineDistance(in_RDI);
          if (fVar11 < 0.0) {
            iVar5 = (int)((fVar11 - (float)((iVar4 / 2) * in_RDI->m_GridFactor)) /
                         (float)(iVar4 * in_RDI->m_GridFactor)) * iVar4 * in_RDI->m_GridFactor;
          }
          else {
            iVar5 = (int)((fVar11 + (float)((iVar4 / 2) * in_RDI->m_GridFactor)) /
                         (float)(iVar4 * in_RDI->m_GridFactor)) * iVar4 * in_RDI->m_GridFactor;
          }
          local_b8 = (float)iVar5;
          if (fVar12 < 0.0) {
            iVar4 = (int)((fVar12 - (float)((iVar4 / 2) * in_RDI->m_GridFactor)) /
                         (float)(iVar4 * in_RDI->m_GridFactor)) * iVar4 * in_RDI->m_GridFactor;
          }
          else {
            iVar4 = (int)((fVar12 + (float)((iVar4 / 2) * in_RDI->m_GridFactor)) /
                         (float)(iVar4 * in_RDI->m_GridFactor)) * iVar4 * in_RDI->m_GridFactor;
          }
          local_bc = (float)iVar4;
          in_stack_ffffffffffffff38 = in_RSI[4].x;
          in_stack_ffffffffffffff34 = in_RSI[4].y;
          iVar4 = f2fx(local_b8);
          in_RSI[4].x = iVar4;
          iVar4 = f2fx(local_bc);
          in_RSI[4].y = iVar4;
          in_stack_ffffffffffffff38 = in_RSI[4].x - in_stack_ffffffffffffff38;
          in_stack_ffffffffffffff34 = in_RSI[4].y - in_stack_ffffffffffffff34;
          for (in_stack_ffffffffffffff30 = 0; in_stack_ffffffffffffff30 < 4;
              in_stack_ffffffffffffff30 = in_stack_ffffffffffffff30 + 1) {
            in_RSI[in_stack_ffffffffffffff30].x =
                 in_stack_ffffffffffffff38 + in_RSI[in_stack_ffffffffffffff30].x;
            in_RSI[in_stack_ffffffffffffff30].y =
                 in_stack_ffffffffffffff34 + in_RSI[in_stack_ffffffffffffff30].y;
          }
        }
      }
      else if (DoQuad::s_Operation == 3) {
        for (local_d8 = 0; local_d8 < 4; local_d8 = local_d8 + 1) {
          in_RSI[local_d8] = DoQuad::s_RotatePoints[local_d8];
          Rotate((CPoint *)in_RDI,
                 (CPoint *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (float)((ulong)in_stack_ffffffffffffff10 >> 0x20));
        }
      }
    }
    DoQuad::s_RotateAngle = in_RDI->m_MouseDeltaX * 0.002 + DoQuad::s_RotateAngle;
    if (DoQuad::s_Operation == 4) {
      DoQuad::s_LastWx = fVar11;
      DoQuad::s_LastWy = fVar12;
      pCVar6 = UI(in_RDI);
      bVar2 = CUI::MouseButton(pCVar6,1);
      if (!bVar2) {
        pCVar6 = UI(in_RDI);
        pCVar9 = UI(in_RDI);
        fVar11 = CUI::MouseX(pCVar9);
        in_stack_ffffffffffffff1c = (int)fVar11;
        pCVar9 = UI(in_RDI);
        CUI::MouseY(pCVar9);
        CUI::DoPopupMenu((CUI *)in_RDI,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                         (int)((ulong)pCVar6 >> 0x20),(int)pCVar6,in_stack_ffffffffffffff08,
                         (_func_bool_void_ptr_CUIRect *)
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff38);
        in_RDI->m_LockMouse = false;
        DoQuad::s_Operation = 0;
        pCVar6 = UI(in_RDI);
        CUI::SetActiveItem(pCVar6,(void *)0x0);
      }
    }
    else {
      DoQuad::s_LastWx = fVar11;
      DoQuad::s_LastWy = fVar12;
      pCVar6 = UI(in_RDI);
      bVar2 = CUI::MouseButton(pCVar6,0);
      if (!bVar2) {
        in_RDI->m_LockMouse = false;
        DoQuad::s_Operation = 0;
        pCVar6 = UI(in_RDI);
        CUI::SetActiveItem(pCVar6,(void *)0x0);
      }
    }
    Config(in_RDI);
    vVar15 = HexToRgba(in_stack_ffffffffffffff1c);
    local_38._0_8_ = vVar15._0_8_;
    local_28.field_0 = local_38.field_0;
    local_28.field_1 = local_38.field_1;
    local_38._8_8_ = vVar15._8_8_;
    local_28.field_2 = local_38.field_2;
    local_28.field_3 = local_38.field_3;
    local_38 = vVar15;
    goto LAB_001ef397;
  }
  pCVar6 = UI(in_RDI);
  pCVar10 = (CPoint *)CUI::HotItem(pCVar6);
  if (pCVar10 != pID_00) {
    Config(in_RDI);
    vVar15 = HexToRgba(in_stack_ffffffffffffff1c);
    local_58._0_8_ = vVar15._0_8_;
    local_28.field_0 = local_58.field_0;
    local_28.field_1 = local_58.field_1;
    local_58._8_8_ = vVar15._8_8_;
    local_28.field_2 = local_58.field_2;
    local_28.field_3 = local_58.field_3;
    local_58 = vVar15;
    goto LAB_001ef397;
  }
  ms_pUiGotContext = pID_00;
  Config(in_RDI);
  vVar15 = HexToRgba(in_stack_ffffffffffffff1c);
  local_48._0_8_ = vVar15._0_8_;
  local_28.field_0 = local_48.field_0;
  local_28.field_1 = local_48.field_1;
  local_48._8_8_ = vVar15._8_8_;
  local_28.field_2 = local_48.field_2;
  local_28.field_3 = local_48.field_3;
  in_RDI->m_pTooltip =
       "Left mouse button to move. Hold shift to move pivot. Hold ctrl to rotate. Hold alt to ignore grid."
  ;
  local_48 = vVar15;
  pCVar6 = UI(in_RDI);
  bVar2 = CUI::MouseButton(pCVar6,0);
  if (bVar2) {
    pIVar7 = Input(in_RDI);
    uVar3 = (*(pIVar7->super_IInterface)._vptr_IInterface[4])(pIVar7,0x161);
    if ((uVar3 & 1) == 0) {
      pIVar7 = Input(in_RDI);
      uVar3 = (*(pIVar7->super_IInterface)._vptr_IInterface[4])(pIVar7,0x165);
      if ((uVar3 & 1) != 0) goto LAB_001ef1ad;
      pIVar7 = Input(in_RDI);
      uVar3 = (*(pIVar7->super_IInterface)._vptr_IInterface[4])(pIVar7,0x160);
      if ((uVar3 & 1) == 0) {
        pIVar7 = Input(in_RDI);
        uVar3 = (*(pIVar7->super_IInterface)._vptr_IInterface[4])(pIVar7,0x164);
        if ((uVar3 & 1) != 0) goto LAB_001ef1f6;
        DoQuad::s_Operation = 1;
      }
      else {
LAB_001ef1f6:
        in_RDI->m_LockMouse = true;
        DoQuad::s_Operation = 3;
        DoQuad::s_RotateAngle = 0.0;
        DoQuad::s_RotatePoints[0] = *in_RSI;
        DoQuad::s_RotatePoints[1] = in_RSI[1];
        DoQuad::s_RotatePoints[2] = in_RSI[2];
        DoQuad::s_RotatePoints[3] = in_RSI[3];
      }
    }
    else {
LAB_001ef1ad:
      DoQuad::s_Operation = 2;
    }
    pCVar6 = UI(in_RDI);
    CUI::SetActiveItem(pCVar6,pID_00);
    if (in_RDI->m_SelectedQuad != in_EDX) {
      in_RDI->m_SelectedPoints = 0;
    }
    in_RDI->m_SelectedQuad = in_EDX;
    DoQuad::s_LastWx = fVar11;
    DoQuad::s_LastWy = fVar12;
  }
  pCVar6 = UI(in_RDI);
  bVar2 = CUI::MouseButton(pCVar6,1);
  if (bVar2) {
    if (in_RDI->m_SelectedQuad != in_EDX) {
      in_RDI->m_SelectedPoints = 0;
    }
    in_RDI->m_SelectedQuad = in_EDX;
    DoQuad::s_Operation = 4;
    pCVar6 = UI(in_RDI);
    CUI::SetActiveItem(pCVar6,pID_00);
  }
LAB_001ef397:
  pIVar8 = Graphics(in_RDI);
  (*(pIVar8->super_IInterface)._vptr_IInterface[0x21])
            (local_28._0_8_ & 0xffffffff,(ulong)local_28._0_8_ >> 0x20,local_28.field_2.z,
             local_28.field_3.w);
  fVar11 = in_RDI->m_WorldZoom * 5.0;
  this_00 = &local_68;
  IGraphics::CQuadItem::CQuadItem(this_00,x_00,y_00,fVar11,fVar11);
  pIVar8 = Graphics(in_RDI);
  (*(pIVar8->super_IInterface)._vptr_IInterface[0x1c])(pIVar8,this_00,1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::DoQuad(CQuad *q, int Index)
{
	enum
	{
		OP_NONE=0,
		OP_MOVE_ALL,
		OP_MOVE_PIVOT,
		OP_ROTATE,
		OP_CONTEXT_MENU,
	};

	// some basic values
	void *pID = &q->m_aPoints[4]; // use pivot addr as id
	static CPoint s_RotatePoints[4];
	static float s_LastWx;
	static float s_LastWy;
	static int s_Operation = OP_NONE;
	static float s_RotateAngle = 0;
	float wx = UI()->MouseWorldX();
	float wy = UI()->MouseWorldY();

	// get pivot
	float CenterX = fx2f(q->m_aPoints[4].x);
	float CenterY = fx2f(q->m_aPoints[4].y);

	float dx = (CenterX - wx)/m_WorldZoom;
	float dy = (CenterY - wy)/m_WorldZoom;
	if(dx*dx+dy*dy < 50)
		UI()->SetHotItem(pID);

	bool IgnoreGrid;
	if(Input()->KeyIsPressed(KEY_LALT) || Input()->KeyIsPressed(KEY_RALT))
		IgnoreGrid = true;
	else
		IgnoreGrid = false;

	// draw selection background
	if(m_SelectedQuad == Index)
	{
		Graphics()->SetColor(0,0,0,1);
		IGraphics::CQuadItem QuadItem(CenterX, CenterY, 7.0f*m_WorldZoom, 7.0f*m_WorldZoom);
		Graphics()->QuadsDraw(&QuadItem, 1);
	}

	vec4 PivotColor;

	if(UI()->CheckActiveItem(pID))
	{
		if(m_MouseDeltaWx*m_MouseDeltaWx+m_MouseDeltaWy*m_MouseDeltaWy > 0.5f)
		{
			// check if we only should move pivot
			if(s_Operation == OP_MOVE_PIVOT)
			{
				if(m_GridActive && !IgnoreGrid)
				{
					int LineDistance = GetLineDistance();

					float x = 0.0f;
					float y = 0.0f;
					if(wx >= 0)
						x = (int)((wx+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						x = (int)((wx-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					if(wy >= 0)
						y = (int)((wy+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						y = (int)((wy-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);

					q->m_aPoints[4].x = f2fx(x);
					q->m_aPoints[4].y = f2fx(y);
				}
				else
				{
					q->m_aPoints[4].x += f2fx(wx-s_LastWx);
					q->m_aPoints[4].y += f2fx(wy-s_LastWy);
				}
			}
			else if(s_Operation == OP_MOVE_ALL)
			{
				// move all points including pivot
				if(m_GridActive && !IgnoreGrid)
				{
					int LineDistance = GetLineDistance();

					float x = 0.0f;
					float y = 0.0f;
					if(wx >= 0)
						x = (int)((wx+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						x = (int)((wx-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					if(wy >= 0)
						y = (int)((wy+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						y = (int)((wy-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);

					int OldX = q->m_aPoints[4].x;
					int OldY = q->m_aPoints[4].y;
					q->m_aPoints[4].x = f2fx(x);
					q->m_aPoints[4].y = f2fx(y);
					int DiffX = q->m_aPoints[4].x - OldX;
					int DiffY = q->m_aPoints[4].y - OldY;

					for(int v = 0; v < 4; v++)
					{
						q->m_aPoints[v].x += DiffX;
						q->m_aPoints[v].y += DiffY;
					}
				}
				else
				{
					for(int v = 0; v < 5; v++)
					{
							q->m_aPoints[v].x += f2fx(wx-s_LastWx);
							q->m_aPoints[v].y += f2fx(wy-s_LastWy);
					}
				}
			}
			else if(s_Operation == OP_ROTATE)
			{
				for(int v = 0; v < 4; v++)
				{
					q->m_aPoints[v] = s_RotatePoints[v];
					Rotate(&q->m_aPoints[4], &q->m_aPoints[v], s_RotateAngle);
				}
			}
		}

		s_RotateAngle += (m_MouseDeltaX) * 0.002f;
		s_LastWx = wx;
		s_LastWy = wy;

		if(s_Operation == OP_CONTEXT_MENU)
		{
			if(!UI()->MouseButton(1))
			{
				UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 180, this, PopupQuad);
				m_LockMouse = false;
				s_Operation = OP_NONE;
				UI()->SetActiveItem(0);
			}
		}
		else
		{
			if(!UI()->MouseButton(0))
			{
				m_LockMouse = false;
				s_Operation = OP_NONE;
				UI()->SetActiveItem(0);
			}
		}

		PivotColor = HexToRgba(Config()->m_EdColorQuadPivotActive);
	}
	else if(UI()->HotItem() == pID)
	{
		ms_pUiGotContext = pID;

		PivotColor = HexToRgba(Config()->m_EdColorQuadPivotHover);
		m_pTooltip = "Left mouse button to move. Hold shift to move pivot. Hold ctrl to rotate. Hold alt to ignore grid.";

		if(UI()->MouseButton(0))
		{
			if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
				s_Operation = OP_MOVE_PIVOT;
			else if(Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))
			{
				m_LockMouse = true;
				s_Operation = OP_ROTATE;
				s_RotateAngle = 0;
				s_RotatePoints[0] = q->m_aPoints[0];
				s_RotatePoints[1] = q->m_aPoints[1];
				s_RotatePoints[2] = q->m_aPoints[2];
				s_RotatePoints[3] = q->m_aPoints[3];
			}
			else
				s_Operation = OP_MOVE_ALL;

			UI()->SetActiveItem(pID);
			if(m_SelectedQuad != Index)
				m_SelectedPoints = 0;
			m_SelectedQuad = Index;
			s_LastWx = wx;
			s_LastWy = wy;
		}

		if(UI()->MouseButton(1))
		{
			if(m_SelectedQuad != Index)
				m_SelectedPoints = 0;
			m_SelectedQuad = Index;
			s_Operation = OP_CONTEXT_MENU;
			UI()->SetActiveItem(pID);
		}
	}
	else
		PivotColor = HexToRgba(Config()->m_EdColorQuadPivot);

	Graphics()->SetColor(PivotColor.r, PivotColor.g, PivotColor.b, PivotColor.a);
	IGraphics::CQuadItem QuadItem(CenterX, CenterY, 5.0f*m_WorldZoom, 5.0f*m_WorldZoom);
	Graphics()->QuadsDraw(&QuadItem, 1);
}